

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O1

void __thiscall higan::InetAddress::InetAddress(InetAddress *this)

{
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"FF.FF.FF.FF","");
  (this->ip_)._M_dataplus._M_p = (pointer)&(this->ip_).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)this,local_40,local_38 + (long)local_40);
  this->port_ = -1;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

InetAddress::InetAddress():
	InetAddress("FF.FF.FF.FF", -1)
{

}